

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternFuncInfo,_false,_false>::FastVector
          (FastVector<ExternFuncInfo,_false,_false> *this,uint reserved)

{
  ExternFuncInfo *pEVar1;
  uint reserved_local;
  FastVector<ExternFuncInfo,_false,_false> *this_local;
  
  pEVar1 = NULLC::construct<ExternFuncInfo>(reserved);
  this->data = pEVar1;
  if (this->data != (ExternFuncInfo *)0x0) {
    this->max = reserved;
    this->count = 0;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x1c,
                "FastVector<ExternFuncInfo>::FastVector(unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

explicit FastVector(unsigned reserved)
	{
		if(!skipConstructor)
			data = NULLC::construct<T>(reserved);
		else
			data = (T*)NULLC::alignedAlloc(sizeof(T) * reserved);

		assert(data);

		if(zeroNewMemory)
			NULLC::fillMemory(data, 0, reserved * sizeof(T));

		max = reserved;
		count = 0;
	}